

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O2

longdouble * csv::internals::pow10<unsigned_int>(uint *n)

{
  int iVar1;
  longdouble *plVar2;
  
  plVar2 = (longdouble *)(ulong)*n;
  do {
    iVar1 = (int)plVar2;
    plVar2 = (longdouble *)(ulong)(iVar1 - 1);
  } while (iVar1 != 0);
  return plVar2;
}

Assistant:

HEDLEY_CONST CONSTEXPR_14
        long double pow10(const unsigned& n) noexcept {
            long double multiplicand = n > 0 ? 10 : 0.1,
                ret = 1;

            for (unsigned i = 0; i < n; i++) {
                ret *= multiplicand;
            }

            return ret;
        }